

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O0

Pubkey * __thiscall
cfd::core::Pubkey::operator+=(Pubkey *__return_storage_ptr__,Pubkey *this,Pubkey *right)

{
  Pubkey *this_00;
  undefined1 local_38 [8];
  Pubkey key;
  Pubkey *right_local;
  Pubkey *this_local;
  
  this_00 = __return_storage_ptr__;
  key.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)right;
  CombinePubkey((Pubkey *)local_38,this,right);
  operator=(this,(Pubkey *)local_38);
  Pubkey(this_00,__return_storage_ptr__);
  ~Pubkey((Pubkey *)0x44fa1f);
  return this_00;
}

Assistant:

Pubkey Pubkey::operator+=(const Pubkey &right) {
  Pubkey key = Pubkey::CombinePubkey(*this, right);
  *this = key;
  return *this;
}